

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCall3(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,bool allowFailure,bool allowInternal,
                   bool allowFastLookup)

{
  Allocator *pAVar1;
  ExprBase *pEVar2;
  long lVar3;
  ArrayView<ArgumentData> arguments;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [8];
  SmallArray<ArgumentData,_3U> local_d0;
  
  pAVar1 = ctx->allocator;
  lVar3 = 0x20;
  do {
    *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0;
    auStack_d8[lVar3] = 0;
    *(undefined8 *)((long)local_d0.little + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)local_d0.little + lVar3 + -8) = 0;
    *(undefined8 *)((long)&local_d0.little[0].source + lVar3) = 0;
    *(undefined8 *)(&local_d0.little[0].isExplicit + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xb0);
  local_d0.data = local_d0.little;
  local_d0.max = 3;
  local_d0.little[0].source = arg0->source;
  local_d0.little[0].type = arg0->type;
  local_d0.little[0].isExplicit = false;
  local_d0.little[0].name = (SynIdentifier *)0x0;
  local_d0.little[0].valueFunction = (FunctionData *)0x0;
  local_d0.little[1].source = arg1->source;
  local_d0.little[1].type = arg1->type;
  local_d0.little[1].isExplicit = false;
  local_d0.little[1].name = (SynIdentifier *)0x0;
  local_d0.little[1].valueFunction = (FunctionData *)0x0;
  local_d0.little[2].source = arg2->source;
  local_d0.little[2].type = arg2->type;
  local_d0.count = 3;
  local_d0.little[2].isExplicit = false;
  local_d0.little[2].name = (SynIdentifier *)0x0;
  local_d0.little[2].value = arg2;
  local_d0.little[2].valueFunction = (FunctionData *)0x0;
  arguments._8_8_ = 3;
  arguments.data = local_d0.data;
  local_d0.little[0].value = arg0;
  local_d0.little[1].value = arg1;
  local_d0.allocator = pAVar1;
  pEVar2 = CreateFunctionCallByName
                     (ctx,source,name,arguments,allowFailure,allowInternal,allowFastLookup);
  uStack_e0 = 0x17304d;
  SmallArray<ArgumentData,_3U>::~SmallArray(&local_d0);
  return pEVar2;
}

Assistant:

ExprBase* CreateFunctionCall3(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 3> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}